

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void run(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int path [16];
  int aiStack_68 [16];
  
  if (0 < nodeNum) {
    lVar3 = 0;
    lVar2 = 0;
    iVar1 = nodeNum;
    do {
      if ((0 < *(int *)((long)outDegrees + lVar3)) && (0 < *(int *)((long)inDegrees + lVar3))) {
        iVar1 = (int)lVar2;
        dfs_range1(iVar1,iVar1,1);
        dfs_range2(iVar1,iVar1,1);
        dfs(iVar1,iVar1,1,aiStack_68);
        iVar1 = nodeNum;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar2 < iVar1);
  }
  return;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}